

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascii-cursor.c
# Opt level: O1

int coda_ascii_cursor_read_string(coda_cursor_conflict *cursor,char *dst,long dst_size)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  ulong in_RAX;
  long lVar4;
  coda_type *pcVar5;
  long length;
  int64_t bit_size_boundary;
  ulong local_38;
  
  pcVar5 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
  if (99 < pcVar5->format) {
    pcVar5 = *(coda_type **)&pcVar5->type_class;
  }
  uVar1 = cursor->stack[(long)cursor->n + -1].bit_offset;
  if ((uVar1 & 7) != 0) {
    coda_set_error(-300,"product error detected (text does not start at byte boundary)");
    return -1;
  }
  if (-1 < pcVar5->bit_size) {
    iVar3 = get_bit_size_boundary(cursor,(int64_t *)&local_38,pcVar5->bit_size);
    if (iVar3 != 0) {
      return -1;
    }
    lVar4 = pcVar5->bit_size >> 3;
    goto LAB_00151642;
  }
  local_38 = in_RAX;
  iVar3 = coda_ascii_cursor_get_bit_size(cursor,(int64_t *)&local_38);
  if (iVar3 == 0) {
    if ((local_38 & 7) != 0) {
      coda_set_error(-300,"product error detected (text does not have a rounded byte size)");
      goto LAB_00151637;
    }
    lVar4 = (long)local_38 >> 3;
    bVar2 = true;
  }
  else {
LAB_00151637:
    lVar4 = 0;
    bVar2 = false;
  }
  if (!bVar2) {
    return -1;
  }
LAB_00151642:
  length = dst_size + -1;
  if (lVar4 < dst_size) {
    length = lVar4;
  }
  if (length < 1) {
    *dst = '\0';
  }
  else {
    iVar3 = read_bytes(cursor->product,(long)uVar1 >> 3,length,dst);
    if (iVar3 != 0) {
      return -1;
    }
    dst[length] = '\0';
  }
  return 0;
}

Assistant:

int coda_ascii_cursor_read_string(const coda_cursor *cursor, char *dst, long dst_size)
{
    coda_type *type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    int64_t bit_offset = cursor->stack[cursor->n - 1].bit_offset;
    int64_t read_size = 0;

    if ((bit_offset & 0x7) != 0)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "product error detected (text does not start at byte boundary)");
        return -1;
    }
    if (type->bit_size < 0)
    {
        int64_t bit_size;

        if (coda_ascii_cursor_get_bit_size(cursor, &bit_size) != 0)
        {
            return -1;
        }
        if ((bit_size & 0x7) != 0)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "product error detected (text does not have a rounded byte size)");
            return -1;
        }
        read_size = bit_size >> 3;
    }
    else
    {
        int64_t bit_size_boundary;

        /* get_bit_size_boundary() will check that type->bit_size is within the expected boundaries */
        if (get_bit_size_boundary(cursor, &bit_size_boundary, type->bit_size) != 0)
        {
            return -1;
        }
        read_size = type->bit_size >> 3;
    }
    if (read_size + 1 > dst_size)       /* account for terminating zero */
    {
        read_size = dst_size - 1;
    }
    if (read_size > 0)
    {
        if (read_bytes(cursor->product, bit_offset >> 3, read_size, dst) != 0)
        {
            return -1;
        }
        dst[read_size] = '\0';
    }
    else
    {
        dst[0] = '\0';
    }

    return 0;
}